

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O3

void __thiscall QGraphicsSceneIndex::clear(QGraphicsSceneIndex *this)

{
  int *piVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  uStack_34 = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  (**(code **)(*(long *)this + 0x60))(&local_38,this,1);
  if (local_28 != (undefined1 *)0x0) {
    puVar2 = (undefined1 *)0x0;
    do {
      (**(code **)(*(long *)this + 0xb8))
                (this,*(undefined8 *)(CONCAT44(uStack_2c,uStack_30) + (long)puVar2 * 8));
      puVar2 = puVar2 + 1;
    } while (puVar2 < local_28);
  }
  piVar1 = (int *)CONCAT44(uStack_34,local_38);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_34,local_38),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneIndex::clear()
{
    const QList<QGraphicsItem *> allItems = items();
    for (int i = 0 ; i < allItems.size(); ++i)
        removeItem(allItems.at(i));
}